

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::PaddingLayerParams::_InternalSerialize
          (PaddingLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  PaddingLayerParams_PaddingConstant *value;
  PaddingLayerParams_PaddingReflection *value_00;
  PaddingLayerParams_PaddingReplication *value_01;
  uint8_t *puVar2;
  BorderAmounts *value_02;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  PaddingLayerParams *this_local;
  
  bVar1 = _internal_has_constant(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = _Internal::constant(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>
                             (1,value,puVar2,stream);
  }
  bVar1 = _internal_has_reflection(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::reflection(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::PaddingLayerParams_PaddingReflection>
                             (2,value_00,puVar2,stream);
  }
  bVar1 = _internal_has_replication(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _Internal::replication(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::PaddingLayerParams_PaddingReplication>
                             (3,value_01,puVar2,stream);
  }
  bVar1 = _internal_has_paddingamounts(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _Internal::paddingamounts(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::BorderAmounts>
                             (10,value_02,puVar2,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* PaddingLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.PaddingLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
  if (_internal_has_constant()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::constant(this), target, stream);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
  if (_internal_has_reflection()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::reflection(this), target, stream);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
  if (_internal_has_replication()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::replication(this), target, stream);
  }

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->_internal_has_paddingamounts()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::paddingamounts(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.PaddingLayerParams)
  return target;
}